

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_seek_to_start_of_stream(ma_dr_mp3 *pMP3)

{
  ma_bool32 mVar1;
  
  mVar1 = (*pMP3->onSeek)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
  if (mVar1 != 0) {
    pMP3->streamCursor = 0;
    ma_dr_mp3_reset(pMP3);
  }
  return (uint)(mVar1 != 0);
}

Assistant:

static ma_bool32 ma_dr_mp3_seek_to_start_of_stream(ma_dr_mp3* pMP3)
{
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(pMP3->onSeek != NULL);
    if (!ma_dr_mp3__on_seek(pMP3, 0, ma_dr_mp3_seek_origin_start)) {
        return MA_FALSE;
    }
    ma_dr_mp3_reset(pMP3);
    return MA_TRUE;
}